

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

LogicalType * __thiscall
duckdb::ArrowType::GetDuckType
          (LogicalType *__return_storage_ptr__,ArrowType *this,bool use_dictionary)

{
  ArrowTypeExtensionData *pAVar1;
  ArrowListInfo *pAVar2;
  type pAVar3;
  LogicalType *pLVar4;
  pointer pAVar5;
  ArrowStructInfo *pAVar6;
  ArrowType *pAVar7;
  string *psVar8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  idx_t i;
  ulong uVar9;
  pointer local_108;
  pointer ppStack_100;
  pointer local_f8;
  LogicalType *local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_e8;
  LogicalType local_b0;
  LogicalType local_98;
  LogicalType local_80;
  child_list_t<LogicalType> local_68;
  child_list_t<LogicalType> local_48;
  
LAB_01a9b249:
  if ((use_dictionary & 1U) != 0) {
    if ((this->dictionary_type).
        super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
        super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
        super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl != (ArrowType *)0x0)
    goto code_r0x01a9b255;
    pLVar4 = &this->type;
    local_f0 = pLVar4;
    switch((this->type).id_) {
    case STRUCT:
      pAVar5 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
               operator->(&this->type_info);
      pAVar6 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(pAVar5);
      local_108 = (pointer)0x0;
      ppStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)(pAVar6->children).
                                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pAVar6->children).
                                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1)
      {
        pAVar7 = ArrowStructInfo::GetChild(pAVar6,uVar9);
        psVar8 = StructType::GetChildName_abi_cxx11_(local_f0,uVar9);
        GetDuckType(&local_80,pAVar7,true);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::pair<duckdb::LogicalType,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)&local_e8,psVar8,&local_80);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_108,&local_e8);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 *)&local_e8);
        LogicalType::~LogicalType(&local_80);
      }
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_108;
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppStack_100;
      local_48.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
      local_108 = (pointer)0x0;
      ppStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      LogicalType::STRUCT(__return_storage_ptr__,&local_48);
      this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_48;
      break;
    case LIST:
      pAVar5 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
               operator->(&this->type_info);
      pAVar2 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar5);
      pAVar3 = shared_ptr<duckdb::ArrowType,_true>::operator*(&pAVar2->child);
      GetDuckType((LogicalType *)&local_e8,pAVar3,true);
      LogicalType::LIST(__return_storage_ptr__,(LogicalType *)&local_e8);
      goto LAB_01a9b446;
    case MAP:
      pAVar5 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
               operator->(&this->type_info);
      pAVar2 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar5);
      pAVar3 = shared_ptr<duckdb::ArrowType,_true>::operator*(&pAVar2->child);
      GetDuckType((LogicalType *)&local_e8,pAVar3,true);
      pLVar4 = StructType::GetChildType((LogicalType *)&local_e8,0);
      LogicalType::LogicalType(&local_98,pLVar4);
      pLVar4 = StructType::GetChildType((LogicalType *)&local_e8,1);
      LogicalType::LogicalType(&local_b0,pLVar4);
      LogicalType::MAP(__return_storage_ptr__,&local_98,&local_b0);
      LogicalType::~LogicalType(&local_b0);
      LogicalType::~LogicalType(&local_98);
LAB_01a9b446:
      LogicalType::~LogicalType((LogicalType *)&local_e8);
      return __return_storage_ptr__;
    default:
      if ((this->extension_data).internal.
          super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) goto LAB_01a9b368;
      goto LAB_01a9b26f;
    case UNION:
      pAVar5 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
               operator->(&this->type_info);
      pAVar6 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(pAVar5);
      local_108 = (pointer)0x0;
      ppStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)(pAVar6->children).
                                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pAVar6->children).
                                super_vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1)
      {
        pAVar7 = ArrowStructInfo::GetChild(pAVar6,uVar9);
        psVar8 = UnionType::GetMemberName_abi_cxx11_(local_f0,uVar9);
        GetDuckType(&local_80,pAVar7,true);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::pair<duckdb::LogicalType,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)&local_e8,psVar8,&local_80);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_108,&local_e8);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 *)&local_e8);
        LogicalType::~LogicalType(&local_80);
      }
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_108;
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppStack_100;
      local_68.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
      local_108 = (pointer)0x0;
      ppStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      LogicalType::UNION(__return_storage_ptr__,&local_68);
      this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_68;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_108);
    return __return_storage_ptr__;
  }
  if ((this->extension_data).internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pLVar4 = &this->type;
  }
  else {
LAB_01a9b26f:
    pAVar1 = shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->(&this->extension_data);
    pLVar4 = &pAVar1->duckdb_type;
  }
LAB_01a9b368:
  LogicalType::LogicalType(__return_storage_ptr__,pLVar4);
  return __return_storage_ptr__;
code_r0x01a9b255:
  this = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                   (&this->dictionary_type);
  use_dictionary = false;
  goto LAB_01a9b249;
}

Assistant:

LogicalType ArrowType::GetDuckType(bool use_dictionary) const {
	if (use_dictionary && dictionary_type) {
		return dictionary_type->GetDuckType();
	}
	if (!use_dictionary) {
		if (extension_data) {
			return extension_data->GetDuckDBType();
		}
		return type;
	}
	// Dictionaries can exist in arbitrarily nested schemas
	// have to reconstruct the type
	auto id = type.id();
	switch (id) {
	case LogicalTypeId::STRUCT: {
		auto &struct_info = type_info->Cast<ArrowStructInfo>();
		child_list_t<LogicalType> new_children;
		for (idx_t i = 0; i < struct_info.ChildCount(); i++) {
			auto &child = struct_info.GetChild(i);
			auto &child_name = StructType::GetChildName(type, i);
			new_children.emplace_back(std::make_pair(child_name, child.GetDuckType(true)));
		}
		return LogicalType::STRUCT(std::move(new_children));
	}
	case LogicalTypeId::LIST: {
		auto &list_info = type_info->Cast<ArrowListInfo>();
		auto &child = list_info.GetChild();
		return LogicalType::LIST(child.GetDuckType(true));
	}
	case LogicalTypeId::MAP: {
		auto &list_info = type_info->Cast<ArrowListInfo>();
		auto &struct_child = list_info.GetChild();
		auto struct_type = struct_child.GetDuckType(true);
		return LogicalType::MAP(StructType::GetChildType(struct_type, 0), StructType::GetChildType(struct_type, 1));
	}
	case LogicalTypeId::UNION: {
		auto &union_info = type_info->Cast<ArrowStructInfo>();
		child_list_t<LogicalType> new_children;
		for (idx_t i = 0; i < union_info.ChildCount(); i++) {
			auto &child = union_info.GetChild(i);
			auto &child_name = UnionType::GetMemberName(type, i);
			new_children.emplace_back(std::make_pair(child_name, child.GetDuckType(true)));
		}
		return LogicalType::UNION(std::move(new_children));
	}
	default: {
		if (extension_data) {
			return extension_data->GetDuckDBType();
		}
		return type;
	}
	}
}